

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bool compareFile(string *a,string *b)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  reference __s1;
  reference __s2;
  int rc1;
  int rc0;
  undefined1 auStack_20040 [8];
  File fp1;
  File fp0;
  array<unsigned_char,_65536UL> temp1;
  array<unsigned_char,_65536UL> temp0;
  string *b_local;
  string *a_local;
  
  File::File((File *)&fp1.fp_,a,READ);
  File::File((File *)auStack_20040,b,READ);
  while( true ) {
    sVar3 = File::Read<unsigned_char,65536ul>
                      ((File *)&fp1.fp_,(array<unsigned_char,_65536UL> *)(temp1._M_elems + 0xfff8));
    iVar1 = (int)sVar3;
    sVar3 = File::Read<unsigned_char,65536ul>
                      ((File *)auStack_20040,(array<unsigned_char,_65536UL> *)&fp0.fp_);
    if (iVar1 != (int)sVar3) {
      a_local._7_1_ = false;
      goto LAB_001fa257;
    }
    __s1 = std::array<unsigned_char,_65536UL>::operator[]
                     ((array<unsigned_char,_65536UL> *)(temp1._M_elems + 0xfff8),0);
    __s2 = std::array<unsigned_char,_65536UL>::operator[]
                     ((array<unsigned_char,_65536UL> *)&fp0.fp_,0);
    iVar2 = memcmp(__s1,__s2,(long)iVar1);
    if (iVar2 != 0) break;
    if (iVar1 < 1) {
      a_local._7_1_ = true;
LAB_001fa257:
      File::~File((File *)auStack_20040);
      File::~File((File *)&fp1.fp_);
      return a_local._7_1_;
    }
  }
  a_local._7_1_ = false;
  goto LAB_001fa257;
}

Assistant:

bool compareFile(const std::string& a, const std::string& b)
{
    std::array<uint8_t, 65536> temp0;
    std::array<uint8_t, 65536> temp1;
    File fp0 = File{a};
    File fp1 = File{b};
    while (true) {
        int rc0 = fp0.Read(temp0);
        int rc1 = fp1.Read(temp1);
        if (rc0 != rc1)
            return false;
        if (memcmp(&temp0[0], &temp1[0], rc0) != 0)
            return false;
        if (rc0 <= 0)
            break;
    }
    return true;
}